

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sharpyuv_gamma.c
# Opt level: O0

void SharpYuvInitGammaTables(void)

{
  double dVar1;
  double value_1;
  double g_1;
  double scale;
  double value;
  double g;
  double a_rec;
  double norm;
  double final_scale;
  double thresh;
  double a;
  int v;
  double local_58;
  double local_40;
  int local_4;
  
  if (kGammaTablesSOk == 0) {
    for (local_4 = 0; local_4 < 0x401; local_4 = local_4 + 1) {
      local_40 = (double)local_4 * 0.0009765625;
      if (0.08124285829863151 < local_40) {
        local_40 = pow((local_40 + 0.09929682680944) * 0.909672415686275,2.2222222222222223);
      }
      else {
        local_40 = local_40 / 4.5;
      }
      kGammaToLinearTabS[local_4] = (uint32_t)(long)(local_40 * 65536.0 + 0.5);
    }
    kGammaToLinearTabS[0x401] = kGammaToLinearTabS[0x400];
    for (local_4 = 0; local_4 < 0x201; local_4 = local_4 + 1) {
      local_58 = (double)local_4 * 0.001953125;
      if (0.018053968510807 < local_58) {
        dVar1 = pow(local_58,0.44999999999999996);
        local_58 = dVar1 * 1.09929682680944 + -0.09929682680944;
      }
      else {
        local_58 = local_58 * 4.5;
      }
      kLinearToGammaTabS[local_4] = (uint32_t)(long)(local_58 * 65536.0 + 0.5);
    }
    kLinearToGammaTabS[0x201] = kLinearToGammaTabS[0x200];
    kGammaTablesSOk = 1;
  }
  return;
}

Assistant:

void SharpYuvInitGammaTables(void) {
  assert(GAMMA_TO_LINEAR_BITS <= 16);
  if (!kGammaTablesSOk) {
    int v;
    const double a = 0.09929682680944;
    const double thresh = 0.018053968510807;
    const double final_scale = 1 << GAMMA_TO_LINEAR_BITS;
    // Precompute gamma to linear table.
    {
      const double norm = 1. / GAMMA_TO_LINEAR_TAB_SIZE;
      const double a_rec = 1. / (1. + a);
      for (v = 0; v <= GAMMA_TO_LINEAR_TAB_SIZE; ++v) {
        const double g = norm * v;
        double value;
        if (g <= thresh * 4.5) {
          value = g / 4.5;
        } else {
          value = pow(a_rec * (g + a), kGammaF);
        }
        kGammaToLinearTabS[v] = (uint32_t)(value * final_scale + .5);
      }
      // to prevent small rounding errors to cause read-overflow:
      kGammaToLinearTabS[GAMMA_TO_LINEAR_TAB_SIZE + 1] =
          kGammaToLinearTabS[GAMMA_TO_LINEAR_TAB_SIZE];
    }
    // Precompute linear to gamma table.
    {
      const double scale = 1. / LINEAR_TO_GAMMA_TAB_SIZE;
      for (v = 0; v <= LINEAR_TO_GAMMA_TAB_SIZE; ++v) {
        const double g = scale * v;
        double value;
        if (g <= thresh) {
          value = 4.5 * g;
        } else {
          value = (1. + a) * pow(g, 1. / kGammaF) - a;
        }
        kLinearToGammaTabS[v] =
            (uint32_t)(final_scale * value + 0.5);
      }
      // to prevent small rounding errors to cause read-overflow:
      kLinearToGammaTabS[LINEAR_TO_GAMMA_TAB_SIZE + 1] =
          kLinearToGammaTabS[LINEAR_TO_GAMMA_TAB_SIZE];
    }
    kGammaTablesSOk = 1;
  }
}